

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::
     call_func<chaiscript::dispatch::detail::Fun_Caller<bool,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&>,bool,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&,0ul,1ul>
               (undefined8 param_1,
               Fun_Caller<bool,_const_chaiscript::Boxed_Value_&,_const_chaiscript::Boxed_Value_&>
               *param_2,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                        *param_3)

{
  byte bVar1;
  Type_Conversions_State *in_stack_000000a0;
  Boxed_Value *in_stack_000000a8;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (param_3,0);
  boxed_cast<chaiscript::Boxed_Value_const&>(in_stack_000000a8,in_stack_000000a0);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (param_3,1);
  boxed_cast<chaiscript::Boxed_Value_const&>(in_stack_000000a8,in_stack_000000a0);
  bVar1 = Fun_Caller<bool,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&>::operator()
                    (param_2,(Boxed_Value *)
                             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                     (Boxed_Value *)0x3bc7c9);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x3bc7d9);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x3bc7e3);
  return (bool)(bVar1 & 1);
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }